

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

void do_cmd_change_name(void)

{
  _Bool _Var1;
  ui_event_type uVar2;
  keycode_t kVar3;
  wchar_t mode;
  char *fmt;
  ui_event uVar4;
  char fname [80];
  char namebuf [32];
  char acStack_488 [80];
  char local_438 [1032];
  
  screen_save();
  mode = L'\0';
  do {
    display_player(mode);
    Term_putstr(L'\x02',L'\x17',L'\xffffffff',L'\x01',
                "[\'c\' to change name, \'f\' to file, \'h\' to change mode, or ESC]");
    uVar4 = inkey_ex();
    uVar2 = uVar4.type;
    if (uVar2 == EVT_BUTTON) {
LAB_001e5e49:
      kVar3 = uVar4.key.code;
      if ((int)kVar3 < 0x81) {
        switch(kVar3) {
        case 99:
          if (arg_force_name == true) {
            fmt = "You are not allowed to change your name!";
LAB_001e5f3b:
            msg(fmt);
          }
          else {
            local_438[0x10] = '\0';
            local_438[0x11] = '\0';
            local_438[0x12] = '\0';
            local_438[0x13] = '\0';
            local_438[0x14] = '\0';
            local_438[0x15] = '\0';
            local_438[0x16] = '\0';
            local_438[0x17] = '\0';
            local_438[0x18] = '\0';
            local_438[0x19] = '\0';
            local_438[0x1a] = '\0';
            local_438[0x1b] = '\0';
            local_438[0x1c] = '\0';
            local_438[0x1d] = '\0';
            local_438[0x1e] = '\0';
            local_438[0x1f] = '\0';
            local_438[0] = '\0';
            local_438[1] = '\0';
            local_438[2] = '\0';
            local_438[3] = '\0';
            local_438[4] = '\0';
            local_438[5] = '\0';
            local_438[6] = '\0';
            local_438[7] = '\0';
            local_438[8] = '\0';
            local_438[9] = '\0';
            local_438[10] = '\0';
            local_438[0xb] = '\0';
            local_438[0xc] = '\0';
            local_438[0xd] = '\0';
            local_438[0xe] = '\0';
            local_438[0xf] = '\0';
            _Var1 = get_character_name(local_438,0x20);
            if (_Var1) {
              my_strcpy(player->full_name,local_438,0x20);
            }
          }
          break;
        case 100:
        case 0x65:
        case 0x67:
        case 0x69:
        case 0x6a:
        case 0x6b:
          break;
        case 0x66:
          player_safe_name(acStack_488,0x50,player->full_name,false);
          my_strcat(acStack_488,".txt",0x50);
          _Var1 = (*get_file)(acStack_488,local_438,0x400);
          if (_Var1) {
            _Var1 = dump_save(local_438);
            fmt = "Character dump failed!";
            if (_Var1) {
              fmt = "Character dump successful.";
            }
            goto LAB_001e5f3b;
          }
          break;
        case 0x68:
switchD_001e5e63_caseD_68:
          mode = ~mode & 1;
          break;
        case 0x6c:
switchD_001e5e63_caseD_6c:
          mode = (mode + L'\xffffffff') -
                 ((mode - (mode + L'\xffffffff' >> 0x1f)) - 1U & 0xfffffffeU);
          break;
        default:
          if (kVar3 == 0x20) goto switchD_001e5e63_caseD_68;
        }
      }
      else {
        if (kVar3 == 0x81) goto switchD_001e5e63_caseD_68;
        if (kVar3 == 0x82) goto switchD_001e5e63_caseD_6c;
        if (kVar3 == 0xe000) goto LAB_001e5f92;
      }
    }
    else {
      if (uVar2 == EVT_MOUSE) {
        if (uVar4.key.code._2_1_ == '\x01') goto switchD_001e5e63_caseD_68;
        if (uVar4.key.code._2_1_ != '\x02') goto switchD_001e5e63_caseD_6c;
LAB_001e5f92:
        event_signal(EVENT_MESSAGE_FLUSH);
        screen_load();
        return;
      }
      if (uVar2 == EVT_KBRD) goto LAB_001e5e49;
    }
    event_signal(EVENT_MESSAGE_FLUSH);
  } while( true );
}

Assistant:

void do_cmd_change_name(void)
{
	ui_event ke;
	int mode = 0;

	const char *p;

	bool more = true;

	/* Prompt */
	p = "['c' to change name, 'f' to file, 'h' to change mode, or ESC]";

	/* Save screen */
	screen_save();

	/* Forever */
	while (more) {
		/* Display the player */
		display_player(mode);

		/* Prompt */
		Term_putstr(2, 23, -1, COLOUR_WHITE, p);

		/* Query */
		ke = inkey_ex();

		if ((ke.type == EVT_KBRD)||(ke.type == EVT_BUTTON)) {
			switch (ke.key.code) {
				case ESCAPE: more = false; break;
				case 'c': {
					if(arg_force_name)
						msg("You are not allowed to change your name!");
					else {
					char namebuf[32] = "";

					/* Set player name */
					if (get_character_name(namebuf, sizeof namebuf))
						my_strcpy(player->full_name, namebuf,
								  sizeof(player->full_name));
					}

					break;
				}

				case 'f': {
					char buf[1024];
					char fname[80];

					/* Get the filesystem-safe name and append .txt */
					player_safe_name(fname, sizeof(fname), player->full_name, false);
					my_strcat(fname, ".txt", sizeof(fname));

					if (get_file(fname, buf, sizeof buf)) {
						if (dump_save(buf))
							msg("Character dump successful.");
						else
							msg("Character dump failed!");
					}
					break;
				}
				
				case 'h':
				case ARROW_LEFT:
				case ' ':
					mode = (mode + 1) % INFO_SCREENS;
					break;

				case 'l':
				case ARROW_RIGHT:
					mode = (mode - 1) % INFO_SCREENS;
					break;
			}
		} else if (ke.type == EVT_MOUSE) {
			if (ke.mouse.button == 1) {
				/* Flip through the screens */			
				mode = (mode + 1) % INFO_SCREENS;
			} else if (ke.mouse.button == 2) {
				/* exit the screen */
				more = false;
			} else {
				/* Flip backwards through the screens */			
				mode = (mode - 1) % INFO_SCREENS;
			}
		}

		/* Flush messages */
		event_signal(EVENT_MESSAGE_FLUSH);
	}

	/* Load screen */
	screen_load();
}